

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CreditCard.cpp
# Opt level: O3

void __thiscall CreditCard::performPayment(CreditCard *this)

{
  ostream *poVar1;
  double dVar2;
  long number;
  string expDate;
  long local_60;
  undefined1 *local_58;
  long local_50;
  undefined1 local_48 [16];
  undefined1 *local_38 [2];
  undefined1 local_28 [16];
  
  local_50 = 0;
  local_48[0] = 0;
  local_58 = local_48;
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Enter Credit Card Number (Without Space): ",0x2a);
  std::istream::_M_extract<long>(&std::cin);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Enter Credit Expiry Date (Without Space) ",0x29);
  std::operator>>((istream *)&std::cin,(string *)&local_58);
  this->number = local_60;
  local_38[0] = local_28;
  std::__cxx11::string::_M_construct<char*>((string *)local_38,local_58,local_58 + local_50);
  std::__cxx11::string::_M_assign((string *)&this->expDate);
  if (local_38[0] != local_28) {
    operator_delete(local_38[0]);
  }
  dVar2 = Payment::getAmount(&this->super_Payment);
  poVar1 = std::ostream::_M_insert<double>(dVar2);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1," is paid with credit card with ",0x1f);
  poVar1 = std::ostream::_M_insert<long>((long)poVar1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1," number",7);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
  std::ostream::put((char)poVar1);
  std::ostream::flush();
  if (local_58 != local_48) {
    operator_delete(local_58);
  }
  return;
}

Assistant:

void CreditCard::performPayment() {
    long number;
    string expDate;

    cout << "Enter Credit Card Number (Without Space): ";
    cin >> number;
    cout << "Enter Credit Expiry Date (Without Space) ";
    cin >> expDate;
    setNumber(number);
    setExpDate(expDate);

    cout << getAmount() << " is paid with credit card with " << getNumber() << " number" << endl;
}